

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

int __thiscall libtorrent::aux::torrent::init(torrent *this,EVP_PKEY_CTX *ctx)

{
  undefined1 *puVar1;
  _Atomic_word *p_Var2;
  vector<download_priority_t,_file_index_t> *this_00;
  uchar uVar3;
  download_priority_t new_piece_priority;
  uint uVar4;
  element_type *this_01;
  add_torrent_params *paVar5;
  element_type *this_02;
  pointer psVar6;
  pointer pppVar7;
  pointer psVar8;
  session_interface *psVar9;
  pointer pcVar10;
  libtorrent *this_03;
  undefined8 uVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  char cVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  file_index_t fVar17;
  file_index_t fVar18;
  int extraout_EAX;
  _Rb_tree_node_base *p_Var19;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar20;
  int64_t iVar21;
  ulong uVar22;
  undefined4 extraout_var;
  pointer pppVar23;
  element_type *peVar24;
  torrent *ptVar25;
  piece_index_t pVar26;
  torrent *this_04;
  EVP_PKEY_CTX *__r;
  size_type __new_size;
  char *in_R9;
  long lVar27;
  int iVar28;
  pointer pbVar29;
  pointer plVar30;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> i;
  long lVar31;
  string_view sVar32;
  string_view rhs;
  peer_request pVar33;
  vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
  ts;
  vector<std::string,_file_index_t> links;
  shared_ptr<libtorrent::aux::peer_connection> pc;
  undefined1 local_1f8 [40];
  pointer local_1d0;
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [28];
  undefined8 uStack_18c;
  undefined8 local_184;
  undefined8 uStack_17c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  shared_ptr<const_libtorrent::torrent_info> local_148;
  resolve_links local_138;
  shared_ptr<const_libtorrent::torrent_info> local_a0;
  pointer local_90;
  per_timer_data *local_88;
  undefined8 uStack_80;
  code *local_78;
  code *pcStack_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  (*(this->super_request_callback)._vptr_request_callback[7])
            (this,"init torrent: %s",
             (((this->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_files).m_name._M_dataplus._M_p);
  this_00 = &this->m_file_priority;
  iVar16 = *(int *)&(this->m_file_priority).
                    super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                    .
                    super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  iVar28 = *(int *)&(this->m_file_priority).
                    super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                    .
                    super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  iVar15 = file_storage::num_files
                     (&((this->super_torrent_hot_members).m_torrent_file.
                        super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->m_files);
  if (iVar15 < iVar16 - iVar28) {
    iVar16 = file_storage::num_files
                       (&((this->super_torrent_hot_members).m_torrent_file.
                          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->m_files);
    ::std::
    vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
    ::resize(&this_00->
              super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
             ,(long)iVar16);
  }
  else if (((((this->m_add_torrent_params)._M_t.
              super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
              ._M_t.
              super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
              .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl)->flags).
            m_val & 0x800000) != 0) {
    iVar16 = file_storage::num_files
                       (&((this->super_torrent_hot_members).m_torrent_file.
                          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->m_files);
    ::std::
    vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
    ::resize(&this_00->
              super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
             ,(long)iVar16,(value_type *)&dont_download);
  }
  sVar32 = torrent_info::ssl_cert
                     ((this->super_torrent_hot_members).m_torrent_file.
                      super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  if (sVar32._M_len != 0) {
    this->field_0x5e0 = this->field_0x5e0 | 2;
    init_ssl(this,sVar32);
  }
  this_01 = (this->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar16 = (this_01->m_files).m_num_pieces;
  if (iVar16 == 0) {
    local_138.m_torrent_file.
    super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2> =
         (__shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)
         errors::make_error_code(torrent_invalid_length);
  }
  else if (iVar16 == 0x7fffffff) {
    local_138.m_torrent_file.
    super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2> =
         (__shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)
         errors::make_error_code(too_many_pieces_in_torrent);
  }
  else {
    if ((this_01->m_files).m_piece_length < 0x1fffc001) {
      paVar5 = (this->m_add_torrent_params)._M_t.
               super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
               .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
      if (paVar5 != (add_torrent_params *)0x0) {
        for (p_Var19 = (paVar5->renamed_files).
                       super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var19 !=
            &(paVar5->renamed_files).
             super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_t._M_impl.super__Rb_tree_header;
            p_Var19 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var19)) {
          if (-1 < (int)p_Var19[1]._M_color) {
            fVar17 = file_storage::end_file(&this_01->m_files);
            if ((int)p_Var19[1]._M_color < fVar17.m_val) {
              torrent_info::rename_file
                        ((this->super_torrent_hot_members).m_torrent_file.
                         super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,(file_index_t)p_Var19[1]._M_color,(string *)&p_Var19[1]._M_parent);
            }
          }
        }
      }
      construct_storage(this);
      if ((((this->super_torrent_hot_members).field_0x4b & 0x20) != 0) &&
         (this_02 = (this->super_torrent_hot_members).m_torrent_file.
                    super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
         0 < (this_02->m_files).m_piece_length)) {
        psVar6 = (this->m_file_priority).
                 super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                 .
                 super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->m_file_priority).
            super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
            .
            super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != psVar6) {
          (this->m_file_priority).
          super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          .
          super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = psVar6;
        }
        iVar16 = file_storage::num_files(&this_02->m_files);
        ::std::
        vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
        ::resize(&this_00->
                  super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                 ,(long)iVar16,(value_type *)&dont_download);
      }
      uVar22 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
      if (((uint)uVar22 >> 0x19 & 1) == 0) {
        *(ulong *)&(this->super_torrent_hot_members).field_0x48 = uVar22 | 0x2000000;
        pppVar23 = (this->super_torrent_hot_members).m_connections.
                   super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   .
                   super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pppVar7 = (this->super_torrent_hot_members).m_connections.
                  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  .
                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (pppVar23 != pppVar7) {
          do {
            __r = (EVP_PKEY_CTX *)
                  &(*pppVar23)->super_enable_shared_from_this<libtorrent::aux::peer_connection>;
            ::std::__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<libtorrent::aux::peer_connection,void>
                      ((__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)
                       &local_138,
                       (__weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
                       __r);
            cVar13 = (**(code **)(*(long *)&(local_138.m_torrent_file.
                                             super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->m_files + 8))();
            if (cVar13 == '\0') {
              peer_connection::on_metadata_impl
                        ((peer_connection *)
                         local_138.m_torrent_file.
                         super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
              cVar13 = (**(code **)(*(long *)&(local_138.m_torrent_file.
                                               super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr)->m_files + 8))();
              if (cVar13 == '\0') {
                peer_connection::init
                          ((peer_connection *)
                           local_138.m_torrent_file.
                           super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,__r);
              }
            }
            if (local_138.m_torrent_file.
                super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_138.m_torrent_file.
                         super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            pppVar23 = pppVar23 + 1;
          } while (pppVar23 != pppVar7);
        }
      }
      if ((this->m_file_priority).
          super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          .
          super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->m_file_priority).
          super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          .
          super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar3 = (this->m_need_save_resume_data).m_val;
        update_piece_priorities(this,this_00);
        (this->m_need_save_resume_data).m_val = uVar3;
      }
      paVar5 = (this->m_add_torrent_params)._M_t.
               super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
               .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
      if (paVar5 != (add_torrent_params *)0x0) {
        __new_size = (size_type)
                     (((this->super_torrent_hot_members).m_torrent_file.
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_files).m_num_pieces;
        if (__new_size <
            (ulong)((long)(paVar5->piece_priorities).
                          super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   *(long *)&(paVar5->piece_priorities).
                             super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                             ._M_impl)) {
          ::std::
          vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          ::resize(&paVar5->piece_priorities,__new_size);
        }
        paVar5 = (this->m_add_torrent_params)._M_t.
                 super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
                 .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
        psVar6 = *(pointer *)
                  &(paVar5->piece_priorities).
                   super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                   ._M_impl;
        psVar8 = (paVar5->piece_priorities).
                 super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (psVar6 != psVar8) {
          lVar31 = 0;
          do {
            new_piece_priority.m_val = psVar6[lVar31].m_val;
            if (((this->super_torrent_hot_members).m_picker._M_t.
                 super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                 .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl !=
                 (piece_picker *)0x0) || (new_piece_priority.m_val != '\x04')) {
              need_picker(this);
              piece_picker::set_piece_priority
                        ((this->super_torrent_hot_members).m_picker._M_t.
                         super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                         .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl
                         ,(piece_index_t)(int)lVar31,new_piece_priority);
            }
            lVar27 = lVar31 + 1;
            lVar31 = lVar31 + 1;
          } while (psVar6 + lVar27 != psVar8);
        }
        update_gauge(this);
      }
      if ((this->field_0x5cc & 4) == 0) {
        need_picker(this);
        this->m_padding_bytes = 0;
        local_138.m_links.
        super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
        .
        super__Vector_base<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_138.m_torrent_file.
        super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2> =
             (__shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)ZEXT816(0);
        iVar20 = file_storage::file_range(&this_01->m_files);
        local_1d0 = (pointer)((ulong)iVar20 >> 0x20);
        if (iVar20._begin.m_val.m_val != iVar20._end.m_val.m_val) {
          do {
            fVar17.m_val = (int)iVar20._begin.m_val;
            bVar14 = file_storage::pad_file_at(&this_01->m_files,fVar17);
            if ((bVar14) &&
               (iVar21 = file_storage::file_size(&this_01->m_files,fVar17), iVar21 != 0)) {
              iVar21 = file_storage::file_size(&this_01->m_files,fVar17);
              pVar33 = file_storage::map_file(&this_01->m_files,fVar17,iVar21 + -1,0);
              uVar22 = pVar33._0_8_;
              if ((((pVar33.start + 1) % (this_01->m_files).m_piece_length == 0) ||
                  (fVar18 = file_storage::end_file(&this_01->m_files),
                  fVar18.m_val + -1 <= fVar17.m_val)) &&
                 (iVar21 = file_storage::file_size(&this_01->m_files,fVar17), 0 < iVar21)) {
                do {
                  pVar26.m_val = (int)uVar22;
                  iVar16 = file_storage::piece_size(&this_01->m_files,pVar26);
                  lVar31 = (long)iVar16;
                  if (iVar21 < iVar16) {
                    lVar31 = iVar21;
                  }
                  local_1a8._0_4_ = pVar26.m_val;
                  iVar28 = (int)lVar31;
                  lVar31 = (long)iVar28;
                  this->m_padding_bytes = this->m_padding_bytes + lVar31;
                  iVar16 = file_storage::piece_size(&this_01->m_files,pVar26);
                  if (iVar16 == iVar28) {
                    if ((pointer)local_138.m_torrent_file.
                                 super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi ==
                        local_138.m_links.
                        super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                        .
                        super__Vector_base<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
                      ::std::
                      vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
                      ::
                      _M_realloc_insert<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&>
                                ((vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
                                  *)&local_138,
                                 (iterator)
                                 local_138.m_torrent_file.
                                 super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi,
                                 (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                                 local_1a8);
                    }
                    else {
                      *(undefined4 *)
                       &(local_138.m_torrent_file.
                         super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->_vptr__Sp_counted_base = local_1a8._0_4_;
                      local_138.m_torrent_file.
                      super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi =
                           local_138.m_torrent_file.
                           super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi + 4;
                    }
                  }
                  piece_picker::set_pad_bytes
                            ((this->super_torrent_hot_members).m_picker._M_t.
                             super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                             .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                             _M_head_impl,(piece_index_t)local_1a8._0_4_,iVar28);
                  uVar22 = (ulong)(pVar26.m_val - 1);
                  lVar27 = iVar21 - lVar31;
                  bVar14 = lVar31 <= iVar21;
                  iVar21 = lVar27;
                } while (lVar27 != 0 && bVar14);
              }
            }
            iVar20._begin.m_val = fVar17.m_val + 1;
            iVar20._end.m_val = 0;
          } while (iVar20._begin.m_val != (uint)local_1d0);
        }
        _Var12._M_pi = local_138.m_torrent_file.
                       super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
        for (peVar24 = local_138.m_torrent_file.
                       super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr; peVar24 != (element_type *)_Var12._M_pi;
            peVar24 = (element_type *)&(peVar24->m_files).m_num_pieces) {
          pVar26.m_val = (peVar24->m_files).m_piece_length;
          bVar14 = piece_picker::have_piece
                             ((this->super_torrent_hot_members).m_picker._M_t.
                              super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                              .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                              _M_head_impl,pVar26);
          if (!bVar14) {
            we_have(this,pVar26,false);
          }
        }
        if (local_138.m_torrent_file.
            super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          operator_delete(local_138.m_torrent_file.
                          super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,(long)local_138.m_links.
                                        super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                                        .
                                        super__Vector_base<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                                        ._M_impl.super__Vector_impl_data._M_start -
                                  (long)local_138.m_torrent_file.
                                        super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr);
        }
      }
      else {
        puVar1 = &(this->super_torrent_hot_members).field_0x4b;
        *puVar1 = *puVar1 | 0x40;
        update_gauge(this);
        update_state_list(this);
        bVar14 = want_tick(this);
        update_list(this,(torrent_list_index_t)0x1,bVar14);
      }
      set_state(this,checking_resume_data);
      local_168.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_168.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      torrent_info::similar_torrents
                ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *
                 )&local_138,
                 (this->super_torrent_hot_members).m_torrent_file.
                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      bVar14 = true;
      if (local_138.m_torrent_file.
          super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)
          local_138.m_torrent_file.
          super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi) {
        torrent_info::collections_abi_cxx11_
                  (&local_48,
                   (this->super_torrent_hot_members).m_torrent_file.
                   super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        bVar14 = local_48.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
                 local_48.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
      }
      if (local_138.m_torrent_file.
          super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        operator_delete(local_138.m_torrent_file.
                        super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,(long)local_138.m_links.
                                      super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                                      .
                                      super__Vector_base<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start -
                                (long)local_138.m_torrent_file.
                                      super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr);
      }
      if (bVar14) {
        local_a0.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (this->super_torrent_hot_members).m_torrent_file.
                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_a0.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (this->super_torrent_hot_members).m_torrent_file.
             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
        if (local_a0.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_a0.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_a0.
                  super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_a0.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_a0.
                  super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        resolve_links::resolve_links(&local_138,&local_a0);
        if (local_a0.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a0.
                     super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        torrent_info::similar_torrents
                  ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                    *)local_1c8,
                   (this->super_torrent_hot_members).m_torrent_file.
                   super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        uVar11 = local_1c8._8_8_;
        if (local_1c8._0_8_ != local_1c8._8_8_) {
          pbVar29 = (pointer)local_1c8._0_8_;
          do {
            psVar9 = (this->super_torrent_hot_members).m_ses;
            local_1a8._0_8_ = (pbVar29->_M_dataplus)._M_p;
            local_1a8._8_8_ = pbVar29->_M_string_length;
            local_1a8._16_4_ = *(undefined4 *)&pbVar29->field_2;
            local_184 = 0;
            uStack_17c = 0;
            local_1a8._20_4_ = 0;
            local_1a8._24_4_ = 0;
            uStack_18c = 0;
            (*(psVar9->super_session_logger)._vptr_session_logger[0x16])
                      (local_1f8,psVar9,(string *)local_1a8);
            ptVar25 = (torrent *)local_1f8._8_8_;
            if ((torrent *)local_1f8._8_8_ != (torrent *)0x0) {
              iVar16 = *(int *)&(((torrent_hot_members *)(local_1f8._8_8_ + 8))->m_picker)._M_t.
                                super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                                .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                                _M_head_impl;
              do {
                if (iVar16 == 0) {
                  ptVar25 = (torrent *)0x0;
                  break;
                }
                LOCK();
                iVar28 = *(int *)&(((torrent_hot_members *)(local_1f8._8_8_ + 8))->m_picker)._M_t.
                                  super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                                  .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                                  _M_head_impl;
                bVar14 = iVar16 == iVar28;
                if (bVar14) {
                  *(int *)&(((torrent_hot_members *)(local_1f8._8_8_ + 8))->m_picker)._M_t.
                           super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                           .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                           _M_head_impl = iVar16 + 1;
                  iVar28 = iVar16;
                }
                iVar16 = iVar28;
                UNLOCK();
              } while (!bVar14);
            }
            if (ptVar25 == (torrent *)0x0) {
              bVar14 = true;
            }
            else {
              bVar14 = *(int *)&(ptVar25->super_torrent_hot_members).m_picker._M_t.
                                super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                                .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                                _M_head_impl == 0;
            }
            this_04 = (torrent *)local_1f8._0_8_;
            if (bVar14) {
              this_04 = (torrent *)0x0;
            }
            if ((torrent *)local_1f8._8_8_ != (torrent *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var2 = (_Atomic_word *)(local_1f8._8_8_ + 0xc);
                iVar16 = *p_Var2;
                *p_Var2 = *p_Var2 + -1;
                UNLOCK();
              }
              else {
                iVar16 = *(_Atomic_word *)(local_1f8._8_8_ + 0xc);
                *(int *)(local_1f8._8_8_ + 0xc) = iVar16 + -1;
              }
              if (iVar16 == 1) {
                (**(code **)(*(long *)&((file_storage *)local_1f8._8_8_)->m_piece_length + 0x18))();
              }
            }
            if ((this_04 != (torrent *)0x0) && (bVar14 = is_seed(this_04), bVar14)) {
              local_1f8._0_8_ =
                   (this_04->super_torrent_hot_members).m_torrent_file.
                   super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              if (((file_storage *)&((torrent *)local_1f8._0_8_)->super_request_callback)->
                  m_piece_length < 1) {
                local_1f8._0_8_ = (torrent *)0x0;
                local_1f8._8_8_ = (torrent *)0x0;
              }
              else {
                local_1f8._8_8_ =
                     (this_04->super_torrent_hot_members).m_torrent_file.
                     super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
                if ((torrent *)local_1f8._8_8_ != (torrent *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    *(int *)&(((torrent *)local_1f8._8_8_)->super_torrent_hot_members).m_picker._M_t
                             .
                             super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                             .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> =
                         *(int *)&(((torrent *)local_1f8._8_8_)->super_torrent_hot_members).m_picker
                                  ._M_t.
                                  super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                                  .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> + 1
                    ;
                    UNLOCK();
                  }
                  else {
                    *(int *)&(((torrent *)local_1f8._8_8_)->super_torrent_hot_members).m_picker._M_t
                             .
                             super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                             .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> =
                         *(int *)&(((torrent *)local_1f8._8_8_)->super_torrent_hot_members).m_picker
                                  ._M_t.
                                  super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                                  .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> + 1
                    ;
                  }
                }
              }
              local_1a8._0_8_ = local_1a8 + 0x10;
              pcVar10 = (this_04->m_save_path)._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)local_1a8,pcVar10,
                         pcVar10 + (this_04->m_save_path)._M_string_length);
              resolve_links::match
                        (&local_138,(shared_ptr<const_libtorrent::torrent_info> *)local_1f8,
                         (string *)local_1a8);
              if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                operator_delete((void *)local_1a8._0_8_,
                                CONCAT44(local_1a8._20_4_,local_1a8._16_4_) + 1);
              }
              if ((torrent *)local_1f8._8_8_ != (torrent *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
              }
            }
            if (ptVar25 != (torrent *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ptVar25);
            }
            pbVar29 = (pointer)((pbVar29->field_2)._M_local_buf + 4);
          } while (pbVar29 != (pointer)uVar11);
        }
        if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ - local_1c8._0_8_);
        }
        torrent_info::collections_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1c8,
                   (this->super_torrent_hot_members).m_torrent_file.
                   super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_1d0 = (pointer)local_1c8._8_8_;
        if (local_1c8._0_8_ != local_1c8._8_8_) {
          pbVar29 = (pointer)local_1c8._0_8_;
          do {
            psVar9 = (this->super_torrent_hot_members).m_ses;
            (*(psVar9->super_session_logger)._vptr_session_logger[0x27])(local_1f8,psVar9,pbVar29);
            uVar11 = local_1f8._8_8_;
            for (ptVar25 = (torrent *)local_1f8._0_8_; ptVar25 != (torrent *)uVar11;
                ptVar25 = (torrent *)&(ptVar25->super_torrent_hot_members).m_hash_picker) {
              bVar14 = is_seed(*(torrent **)
                                &((file_storage *)&ptVar25->super_request_callback)->m_piece_length)
              ;
              if (bVar14) {
                lVar31 = *(long *)&((file_storage *)&ptVar25->super_request_callback)->
                                   m_piece_length;
                local_148.
                super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = *(element_type **)(lVar31 + 0x18);
                if (((local_148.
                      super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->m_files).m_piece_length < 1) {
                  local_148.
                  super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)0x0;
                  local_148.
                  super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                }
                else {
                  local_148.
                  super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi =
                       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar31 + 0x20);
                  if (local_148.
                      super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      (local_148.
                       super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_use_count =
                           (local_148.
                            super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      (local_148.
                       super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_use_count =
                           (local_148.
                            super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_use_count + 1;
                    }
                  }
                }
                lVar31 = *(long *)&((file_storage *)&ptVar25->super_request_callback)->
                                   m_piece_length;
                lVar27 = *(long *)(lVar31 + 0x3c0);
                local_1a8._0_8_ = local_1a8 + 0x10;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)local_1a8,lVar27,*(long *)(lVar31 + 0x3c8) + lVar27);
                resolve_links::match(&local_138,&local_148,(string *)local_1a8);
                if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                  operator_delete((void *)local_1a8._0_8_,
                                  CONCAT44(local_1a8._20_4_,local_1a8._16_4_) + 1);
                }
                if (local_148.
                    super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_148.
                             super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
              }
            }
            ::std::
            vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
            ::~vector((vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                       *)local_1f8);
            pbVar29 = pbVar29 + 1;
          } while (pbVar29 != local_1d0);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1c8);
        if (local_138.m_links.
            super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
            .
            super__Vector_base<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_138.m_links.
            super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
            .
            super__Vector_base<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          iVar16 = file_storage::num_files
                             (&((this->super_torrent_hot_members).m_torrent_file.
                                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->m_files);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize(&local_168,(long)iVar16);
          local_90 = local_138.m_links.
                     super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                     .
                     super__Vector_base<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          if (local_138.m_links.
              super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
              .
              super__Vector_base<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_138.m_links.
              super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
              .
              super__Vector_base<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            plVar30 = local_138.m_links.
                      super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                      .
                      super__Vector_base<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              if ((plVar30->ti).
                  super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr != (element_type *)0x0) {
                local_1d0 = (pointer)(plVar30->save_path)._M_dataplus._M_p;
                this_03 = (libtorrent *)(plVar30->save_path)._M_string_length;
                peVar24 = (plVar30->ti).
                          super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
                fVar17.m_val = (plVar30->file_idx).m_val;
                local_1f8._0_8_ = local_1f8 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"");
                file_storage::file_path
                          ((string *)local_1c8,&peVar24->m_files,fVar17,(string *)local_1f8);
                sVar32._M_str = (char *)local_1c8._8_8_;
                sVar32._M_len = (size_t)local_1d0;
                rhs._M_str = in_R9;
                rhs._M_len = local_1c8._0_8_;
                combine_path_abi_cxx11_((string *)local_1a8,this_03,sVar32,rhs);
                ::std::__cxx11::string::operator=
                          ((string *)
                           (local_168.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + (plVar30->file_idx).m_val),
                           (string *)local_1a8);
                if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                  operator_delete((void *)local_1a8._0_8_,
                                  CONCAT44(local_1a8._20_4_,local_1a8._16_4_) + 1);
                }
                if ((pointer)local_1c8._0_8_ != (pointer)(local_1c8 + 0x10)) {
                  operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
                }
                if ((torrent *)local_1f8._0_8_ != (torrent *)(local_1f8 + 0x10)) {
                  operator_delete((void *)local_1f8._0_8_,(ulong)(local_1f8._16_8_ + 1));
                }
              }
              plVar30 = plVar30 + 1;
            } while (plVar30 != local_90);
          }
        }
        ::std::
        _Hashtable<libtorrent::digest32<256L>,_std::pair<const_libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::digest32<256L>_>,_std::hash<libtorrent::digest32<256L>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
        ::~_Hashtable(&local_138.m_file_roots._M_h);
        ::std::
        _Hashtable<long,_std::pair<const_long,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_long,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
        ::~_Hashtable(&local_138.m_file_sizes._M_h);
        ::std::
        vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
        ::~vector(&local_138.m_links.
                   super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                 );
        if (local_138.m_torrent_file.
            super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_138.m_torrent_file.
                     super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      paVar5 = (this->m_add_torrent_params)._M_t.
               super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
               .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
      if ((paVar5 == (add_torrent_params *)0x0) || (((paVar5->flags).m_val & 0x400000) == 0)) {
        iVar16 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[4])();
        uVar4 = (this->m_storage).m_idx.m_val;
        paVar5 = (this->m_add_torrent_params)._M_t.
                 super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
                 .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
        local_60.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_168.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_60.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_168.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_60.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_168.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_168.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_168.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_168.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<libtorrent::aux::torrent,void>
                  ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&local_138,
                   (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                   &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
        local_78 = (code *)0x0;
        pcStack_70 = (code *)0x0;
        local_88 = (per_timer_data *)0x0;
        uStack_80 = 0;
        local_88 = (per_timer_data *)operator_new(0x10);
        (local_88->op_queue_).front_ =
             (wait_op *)
             local_138.m_torrent_file.
             super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (local_88->op_queue_).back_ = (wait_op *)0x0;
        (local_88->op_queue_).back_ =
             (wait_op *)
             local_138.m_torrent_file.
             super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        local_138.m_torrent_file.
        super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2> =
             (__shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)ZEXT816(0);
        pcStack_70 = ::std::
                     _Function_handler<void_(libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:1993:25)>
                     ::_M_invoke;
        local_78 = ::std::
                   _Function_handler<void_(libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:1993:25)>
                   ::_M_manager;
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar16) + 0x40))
                  ((long *)CONCAT44(extraout_var,iVar16),uVar4,paVar5,&local_60);
        if (local_78 != (code *)0x0) {
          (*local_78)(&local_88,&local_88,3);
        }
        if (local_138.m_torrent_file.
            super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_138.m_torrent_file.
                     super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_60);
        (*(this->super_request_callback)._vptr_request_callback[7])(this,"init, async_check_files");
        (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
          [0x1f])();
      }
      else {
        local_138.m_torrent_file.
        super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             (local_138.m_torrent_file.
              super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._5_8_
             << 0x28);
        local_138.m_torrent_file.
        super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                &boost::system::detail::cat_holder<void>::system_category_instance;
        local_138.m_links.
        super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
        .
        super__Vector_base<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_138.m_links.
                               super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                               .
                               super__Vector_base<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,0xffffff);
        on_resume_data_checked(this,(status_t)0x0,(storage_error *)&local_138);
      }
      update_want_peers(this);
      bVar14 = want_tick(this);
      update_list(this,(torrent_list_index_t)0x1,bVar14);
      maybe_done_flushing(this);
      this->field_0x606 = this->field_0x606 | 0x10;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_168);
      return extraout_EAX;
    }
    local_138.m_torrent_file.
    super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2> =
         (__shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)
         errors::make_error_code(invalid_piece_size);
  }
  set_error(this,(error_code *)&local_138,(file_index_t)0xffffffff);
  iVar16 = pause(this);
  return iVar16;
}

Assistant:

void torrent::init()
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(is_single_thread());

#ifndef TORRENT_DISABLE_LOGGING
		debug_log("init torrent: %s", torrent_file().name().c_str());
#endif

		TORRENT_ASSERT(valid_metadata());
		TORRENT_ASSERT(m_torrent_file->num_files() > 0);
		TORRENT_ASSERT(m_torrent_file->total_size() >= 0);

		if (int(m_file_priority.size()) > m_torrent_file->num_files())
			m_file_priority.resize(m_torrent_file->num_files());
		else if (m_add_torrent_params->flags & torrent_flags::default_dont_download)
			m_file_priority.resize(m_torrent_file->num_files(), dont_download);

		auto cert = m_torrent_file->ssl_cert();
		if (!cert.empty())
		{
			m_ssl_torrent = true;
#ifdef TORRENT_SSL_PEERS
			init_ssl(cert);
#endif
		}

		if (m_torrent_file->num_pieces() > piece_picker::max_pieces)
		{
			set_error(errors::too_many_pieces_in_torrent, torrent_status::error_file_none);
			pause();
			return;
		}

		if (m_torrent_file->num_pieces() == 0)
		{
			set_error(errors::torrent_invalid_length, torrent_status::error_file_none);
			pause();
			return;
		}

		int const blocks_per_piece
			= (m_torrent_file->piece_length() + default_block_size - 1) / default_block_size;
		if (blocks_per_piece > piece_picker::max_blocks_per_piece)
		{
			set_error(errors::invalid_piece_size, torrent_status::error_file_none);
			pause();
			return;
		}

		// --- MAPPED FILES ---
		file_storage const& fs = m_torrent_file->files();
		if (m_add_torrent_params)
		{
			for (auto const& f : m_add_torrent_params->renamed_files)
			{
				if (f.first < file_index_t(0) || f.first >= fs.end_file()) continue;
				m_torrent_file->rename_file(file_index_t(f.first), f.second);
			}
		}

		construct_storage();

#ifndef TORRENT_DISABLE_SHARE_MODE
		if (m_share_mode && valid_metadata())
		{
			// in share mode, all pieces have their priorities initialized to 0
			m_file_priority.clear();
			m_file_priority.resize(m_torrent_file->num_files(), dont_download);
		}
#endif

		// it's important to initialize the peers early, because this is what will
		// fix up their have-bitmasks to have the correct size
		// TODO: 2 add a unit test where we don't have metadata, connect to a peer
		// that sends a bitfield that's too large, then we get the metadata
		if (!m_connections_initialized)
		{
			m_connections_initialized = true;
			// all peer connections have to initialize themselves now that the metadata
			// is available
			// copy the peer list since peers may disconnect and invalidate
			// m_connections as we initialize them
			for (auto* const c : m_connections)
			{
				auto pc = c->self();
				if (pc->is_disconnecting()) continue;
				pc->on_metadata_impl();
				if (pc->is_disconnecting()) continue;
				pc->init();
			}
		}

		// in case file priorities were passed in via the add_torrent_params
		// and also in the case of share mode, we need to update the priorities
		// this has to be applied before piece priority
		if (!m_file_priority.empty())
		{
			// m_file_priority was loaded from the resume data, this doesn't
			// alter any state that needs to be saved in the resume data
			auto const ns = m_need_save_resume_data;
			update_piece_priorities(m_file_priority);
			m_need_save_resume_data = ns;
		}

		if (m_add_torrent_params)
		{
			piece_index_t idx(0);
			if (m_add_torrent_params->piece_priorities.size() > std::size_t(m_torrent_file->num_pieces()))
				m_add_torrent_params->piece_priorities.resize(std::size_t(m_torrent_file->num_pieces()));

			for (auto prio : m_add_torrent_params->piece_priorities)
			{
				if (has_picker() || prio != default_priority)
				{
					need_picker();
					m_picker->set_piece_priority(idx, prio);
				}
				++idx;
			}
			update_gauge();
		}

		if (m_seed_mode)
		{
			m_have_all = true;
			update_gauge();
			update_state_list();
			update_want_tick();
		}
		else
		{
			need_picker();

			TORRENT_ASSERT(block_size() > 0);

			m_padding_bytes = 0;
			std::vector<piece_index_t> have_pieces;

			aux::apply_pad_files(fs, [&](piece_index_t const piece, int const bytes)
			{
				m_padding_bytes += bytes;
				if (bytes == fs.piece_size(piece))
					have_pieces.push_back(piece);
				m_picker->set_pad_bytes(piece, bytes);
			});

			for (auto i : have_pieces)
			{
				// we may have this piece already, if we picked it up from
				// resume data.
				if (m_picker->have_piece(i)) continue;
//				picker().piece_passed(i);
//				TORRENT_ASSERT(picker().have_piece(i));
				we_have(i);
			}
		}

		set_state(torrent_status::checking_resume_data);

		aux::vector<std::string, file_index_t> links;
#ifndef TORRENT_DISABLE_MUTABLE_TORRENTS
		if (!m_torrent_file->similar_torrents().empty()
			|| !m_torrent_file->collections().empty())
		{
			resolve_links res(m_torrent_file);

			for (auto const& ih : m_torrent_file->similar_torrents())
			{
				std::shared_ptr<torrent> t = m_ses.find_torrent(info_hash_t(ih)).lock();
				if (!t) continue;

				// Only attempt to reuse files from torrents that are seeding.
				// TODO: this could be optimized by looking up which files are
				// complete and just look at those
				if (!t->is_seed()) continue;

				res.match(t->get_torrent_file(), t->save_path());
			}
			for (auto const& c : m_torrent_file->collections())
			{
				std::vector<std::shared_ptr<torrent>> ts = m_ses.find_collection(c);

				for (auto const& t : ts)
				{
					// Only attempt to reuse files from torrents that are seeding.
					// TODO: this could be optimized by looking up which files are
					// complete and just look at those
					if (!t->is_seed()) continue;

					res.match(t->get_torrent_file(), t->save_path());
				}
			}

			std::vector<resolve_links::link_t> const& l = res.get_links();
			if (!l.empty())
			{
				links.resize(m_torrent_file->files().num_files());
				for (auto const& i : l)
				{
					if (!i.ti) continue;
					links[i.file_idx] = combine_path(i.save_path
						, i.ti->files().file_path(i.file_idx));
				}
			}
		}
#endif // TORRENT_DISABLE_MUTABLE_TORRENTS

#if TORRENT_USE_ASSERTS
		TORRENT_ASSERT(m_outstanding_check_files == false);
		m_outstanding_check_files = true;
#endif

		if (!m_add_torrent_params || !(m_add_torrent_params->flags & torrent_flags::no_verify_files))
		{
			m_ses.disk_thread().async_check_files(
				m_storage, m_add_torrent_params ? m_add_torrent_params.get() : nullptr
				, std::move(links), [self = shared_from_this()](status_t st, storage_error const& error)
				{ self->on_resume_data_checked(st, error); });
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("init, async_check_files");
#endif
			m_ses.deferred_submit_jobs();
		}
		else
		{
			on_resume_data_checked({}, storage_error{});
		}

		update_want_peers();
		update_want_tick();

		// this will remove the piece picker, if we're done with it
		maybe_done_flushing();

		m_torrent_initialized = true;
	}